

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

State * __thiscall despot::Pocman::CreateStartState(Pocman *this,string tyep)

{
  PocmanState *pocstate;
  
  pocstate = MemoryPool<despot::PocmanState>::Allocate(&this->memory_pool_);
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::resize
            (&pocstate->ghost_pos,(long)this->num_ghosts_);
  std::vector<int,_std::allocator<int>_>::resize(&pocstate->ghost_dir,(long)this->num_ghosts_);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&pocstate->food,(long)(this->maze_).ysize_ * (long)(this->maze_).xsize_,false);
  NewLevel(this,pocstate);
  return &pocstate->super_State;
}

Assistant:

State* Pocman::CreateStartState(string tyep) const {
	PocmanState* startState = memory_pool_.Allocate();
	startState->ghost_pos.resize(num_ghosts_);
	startState->ghost_dir.resize(num_ghosts_);
	startState->food.resize(maze_.xsize() * maze_.ysize());
	NewLevel(*startState);
	return startState;
}